

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::SetNativeEntryPoint
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo,
          JavascriptMethod originalEntryPoint,JavascriptMethod directEntryPoint)

{
  code *pcVar1;
  JavascriptMethod p_Var2;
  bool bVar3;
  ExecutionMode EVar4;
  byte bVar5;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  ProxyEntryPointInfo *pPVar9;
  uint *puVar10;
  uint local_34;
  uint local_30;
  byte local_29;
  JavascriptMethod p_Stack_28;
  bool isAsmJs;
  JavascriptMethod directEntryPoint_local;
  JavascriptMethod originalEntryPoint_local;
  FunctionEntryPointInfo *entryPointInfo_local;
  FunctionBody *this_local;
  
  p_Stack_28 = directEntryPoint;
  directEntryPoint_local = originalEntryPoint;
  originalEntryPoint_local = (JavascriptMethod)entryPointInfo;
  entryPointInfo_local = (FunctionEntryPointInfo *)this;
  bVar3 = EntryPointInfo::IsNativeEntryPointProcessed(&entryPointInfo->super_EntryPointInfo);
  if (!bVar3) {
    local_29 = ParseableFunctionInfo::GetIsAsmjsMode(&this->super_ParseableFunctionInfo);
    BVar6 = IsIntermediateCodeGenThunk(*(JavascriptMethod *)(originalEntryPoint_local + 0x10));
    if ((((BVar6 == 0) && ((DAT_01eb89ea & 1) == 0)) &&
        ((*(uint *)&this->field_0x178 >> 0x1d & 1) == 0)) && ((local_29 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xf55,
                                  "(IsIntermediateCodeGenThunk(entryPointInfo->jsMethod) || (Js::Configuration::Global.flags.Prejit) || this->m_isFromNativeCodeModule || isAsmJs)"
                                  ,
                                  "IsIntermediateCodeGenThunk(entryPointInfo->jsMethod) || CONFIG_FLAG(Prejit) || this->m_isFromNativeCodeModule || isAsmJs"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    EntryPointInfo::EnsureIsReadyToCall((EntryPointInfo *)originalEntryPoint_local);
    p_Var2 = originalEntryPoint_local;
    pPVar9 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
    if ((ProxyEntryPointInfo *)p_Var2 == pPVar9) {
      FunctionProxy::SetOriginalEntryPoint((FunctionProxy *)this,directEntryPoint_local);
    }
    if ((*(int *)(originalEntryPoint_local + 0x78) == 0) &&
       (bVar3 = NeedEnsureDynamicProfileInfo(this), bVar3)) {
      *(code **)(originalEntryPoint_local + 0x10) =
           DynamicProfileInfo::EnsureDynamicProfileInfoThunk;
    }
    else {
      *(JavascriptMethod *)(originalEntryPoint_local + 0x10) = p_Stack_28;
    }
    CaptureDynamicProfileState(this,(FunctionEntryPointInfo *)originalEntryPoint_local);
    EVar4 = FunctionEntryPointInfo::GetJitMode((FunctionEntryPointInfo *)originalEntryPoint_local);
    if (EVar4 == SimpleJit) {
      EVar4 = GetExecutionMode(this);
      if (EVar4 != SimpleJit) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xf6b,"(GetExecutionMode() == ExecutionMode::SimpleJit)",
                                    "GetExecutionMode() == ExecutionMode::SimpleJit");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      SetSimpleJitEntryPointInfo(this,(FunctionEntryPointInfo *)originalEntryPoint_local);
      ResetSimpleJitCallCount(this);
    }
    else {
      EVar4 = FunctionEntryPointInfo::GetJitMode((FunctionEntryPointInfo *)originalEntryPoint_local)
      ;
      if (EVar4 != FullJit) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xf71,
                                    "(entryPointInfo->GetJitMode() == ExecutionMode::FullJit)",
                                    "entryPointInfo->GetJitMode() == ExecutionMode::FullJit");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (((local_29 & 1) == 0) && (EVar4 = GetExecutionMode(this), EVar4 != FullJit)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xf72,
                                    "(isAsmJs || GetExecutionMode() == ExecutionMode::FullJit)",
                                    "isAsmJs || GetExecutionMode() == ExecutionMode::FullJit");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      uVar7 = DAT_01ebb8b4 & 0xff;
      bVar5 = FunctionEntryPointInfo::GetDecrCallCountPerBailout();
      local_30 = uVar7 * (bVar5 - 1);
      local_34 = 0xff;
      puVar10 = min<unsigned_int>(&local_30,&local_34);
      *(uint *)(originalEntryPoint_local + 0x7c) = *puVar10 & 0xff;
    }
    TraceExecutionMode(this,(char *)0x0);
    VTuneChakraProfile::LogMethodNativeLoadEvent
              (this,(FunctionEntryPointInfo *)originalEntryPoint_local);
    EntryPointInfo::SetNativeEntryPointProcessed((EntryPointInfo *)originalEntryPoint_local);
  }
  return;
}

Assistant:

void FunctionBody::SetNativeEntryPoint(FunctionEntryPointInfo* entryPointInfo, JavascriptMethod originalEntryPoint, JavascriptMethod directEntryPoint)
    {
        if (entryPointInfo->IsNativeEntryPointProcessed())
        {
            return;
        }
        bool isAsmJs = this->GetIsAsmjsMode();
        Assert(IsIntermediateCodeGenThunk(entryPointInfo->jsMethod) || CONFIG_FLAG(Prejit) || this->m_isFromNativeCodeModule || isAsmJs);
        entryPointInfo->EnsureIsReadyToCall();

        // keep originalEntryPoint updated with the latest known good native entry point
        if (entryPointInfo == this->GetDefaultEntryPointInfo())
        {
            this->SetOriginalEntryPoint(originalEntryPoint);
        }

        if (entryPointInfo->entryPointIndex == 0 && this->NeedEnsureDynamicProfileInfo())
        {
            entryPointInfo->jsMethod = DynamicProfileInfo::EnsureDynamicProfileInfoThunk;
        }
        else
        {
            entryPointInfo->jsMethod = directEntryPoint;
        }

        this->CaptureDynamicProfileState(entryPointInfo);

        if(entryPointInfo->GetJitMode() == ExecutionMode::SimpleJit)
        {
            Assert(GetExecutionMode() == ExecutionMode::SimpleJit);
            SetSimpleJitEntryPointInfo(entryPointInfo);
            ResetSimpleJitCallCount();
        }
        else
        {
            Assert(entryPointInfo->GetJitMode() == ExecutionMode::FullJit);
            Assert(isAsmJs || GetExecutionMode() == ExecutionMode::FullJit);
            entryPointInfo->callsCount =
                static_cast<uint8>(
                    min(
                        static_cast<uint>(static_cast<uint8>(CONFIG_FLAG(MinBailOutsBeforeRejit))) *
                            (Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout() - 1),
                        0xffu));
        }
        TraceExecutionMode();

        JS_ETW(EtwTrace::LogMethodNativeLoadEvent(this, entryPointInfo));
#ifdef VTUNE_PROFILING
        VTuneChakraProfile::LogMethodNativeLoadEvent(this, entryPointInfo);
#endif

#ifdef _M_ARM
        // For ARM we need to make sure that pipeline is synchronized with memory/cache for newly jitted code.
        _InstructionSynchronizationBarrier();
#endif

        entryPointInfo->SetNativeEntryPointProcessed();
    }